

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O2

int cram_byte_array_stop_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  cram_external_type cVar1;
  ulong uVar2;
  byte bVar3;
  cram_encoding cVar4;
  byte bVar7;
  size_t sVar5;
  uchar *puVar6;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  char *pcVar11;
  size_t sVar12;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  long lStack_50;
  char buf [20];
  
  if (prefix == (char *)0x0) {
    iVar13 = 0;
  }
  else {
    sVar5 = strlen(prefix);
    while( true ) {
      uVar2 = b->alloc;
      if (b->byte + sVar5 < uVar2) break;
      auVar14._8_4_ = (int)(uVar2 >> 0x20);
      auVar14._0_8_ = uVar2;
      auVar14._12_4_ = 0x45300000;
      dVar16 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 1.5;
      uVar10 = (ulong)dVar16;
      sVar12 = (long)(dVar16 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
      if (uVar2 == 0) {
        sVar12 = 0x400;
      }
      b->alloc = sVar12;
      puVar6 = (uchar *)realloc(b->data,sVar12);
      b->data = puVar6;
    }
    memcpy(b->data + b->byte,prefix,sVar5);
    b->byte = b->byte + sVar5;
    iVar13 = (int)sVar5;
  }
  cVar4 = c->codec;
  if (cVar4 < 0x80) {
    pcVar11 = buf + 1;
  }
  else {
    bVar3 = (byte)(cVar4 >> 8);
    if (cVar4 < 0x4000) {
      pcVar11 = buf + 2;
      buf[0] = bVar3 | 0x80;
    }
    else {
      buf[1] = (char)(cVar4 >> 0x10);
      if (cVar4 < 0x200000) {
        pcVar11 = buf + 3;
        buf[0] = buf[1] | 0xc0;
        buf[1] = bVar3;
      }
      else {
        bVar7 = (byte)(cVar4 >> 0x18);
        if (cVar4 < 0x10000000) {
          pcVar11 = buf + 4;
          buf[0] = bVar7 | 0xe0;
          buf[2] = bVar3;
        }
        else {
          pcVar11 = buf + 5;
          buf[0] = bVar7 >> 4 | 0xf0;
          buf[1] = (char)(cVar4 >> 0x14);
          buf[2] = (char)(cVar4 >> 0xc);
          buf[3] = (char)(cVar4 >> 4);
          cVar4 = (cram_encoding)((byte)cVar4 & 0xf);
        }
      }
    }
  }
  pcVar11[-1] = (char)cVar4;
  if ((version & 0xffffff00U) == 0x100) {
    *pcVar11 = '\x05';
    pcVar11[1] = (c->field_6).byte_array_stop.stop;
    *(cram_external_type *)(pcVar11 + 2) = (c->field_6).external.type;
    pcVar11 = pcVar11 + 6;
  }
  else {
    cVar1 = (c->field_6).external.type;
    bVar3 = (byte)cVar1;
    if (cVar1 < 0x80) {
      *pcVar11 = '\x02';
      pcVar11[1] = (c->field_6).byte_array_stop.stop;
      pcVar11[2] = bVar3;
      lStack_50 = 1;
    }
    else {
      bVar7 = (byte)(cVar1 >> 8);
      if (cVar1 < 0x4000) {
        *pcVar11 = '\x03';
        pcVar11[1] = (c->field_6).byte_array_stop.stop;
        pcVar11[2] = bVar7 | 0x80;
        pcVar11[3] = bVar3;
        lStack_50 = 2;
      }
      else {
        bVar8 = (byte)(cVar1 >> 0x10);
        if (cVar1 < 0x200000) {
          *pcVar11 = '\x04';
          pcVar11[1] = (c->field_6).byte_array_stop.stop;
          pcVar11[2] = bVar8 | 0xc0;
          pcVar11[3] = bVar7;
          pcVar11[4] = bVar3;
          lStack_50 = 3;
        }
        else {
          *pcVar11 = '\x06' - (cVar1 < 0x10000000);
          pcVar11[1] = (c->field_6).byte_array_stop.stop;
          bVar9 = (byte)(cVar1 >> 0x18);
          if (cVar1 < 0x10000000) {
            pcVar11[2] = bVar9 | 0xe0;
            pcVar11[3] = bVar8;
            pcVar11[4] = bVar7;
            pcVar11[5] = bVar3;
            lStack_50 = 4;
          }
          else {
            pcVar11[2] = bVar9 >> 4 | 0xf0;
            pcVar11[3] = (char)(cVar1 >> 0x14);
            pcVar11[4] = (char)(cVar1 >> 0xc);
            pcVar11[5] = (char)(cVar1 >> 4);
            pcVar11[6] = bVar3 & 0xf;
            lStack_50 = 5;
          }
        }
      }
    }
    pcVar11 = pcVar11 + lStack_50 + 2;
  }
  sVar5 = (long)pcVar11 - (long)buf;
  while( true ) {
    uVar2 = b->alloc;
    if (b->byte + sVar5 < uVar2) break;
    auVar15._8_4_ = (int)(uVar2 >> 0x20);
    auVar15._0_8_ = uVar2;
    auVar15._12_4_ = 0x45300000;
    dVar16 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 1.5;
    uVar10 = (ulong)dVar16;
    sVar12 = (long)(dVar16 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
    if (uVar2 == 0) {
      sVar12 = 0x400;
    }
    b->alloc = sVar12;
    puVar6 = (uchar *)realloc(b->data,sVar12);
    b->data = puVar6;
  }
  memcpy(b->data + b->byte,buf,sVar5);
  b->byte = b->byte + sVar5;
  return (int)sVar5 + iVar13;
}

Assistant:

int cram_byte_array_stop_encode_store(cram_codec *c, cram_block *b,
				      char *prefix, int version) {
    int len = 0;
    char buf[20], *cp = buf;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    cp += itf8_put(cp, c->codec);

    if (CRAM_MAJOR_VERS(version) == 1) {
	cp += itf8_put(cp, 5);
	*cp++ = c->e_byte_array_stop.stop;
	*cp++ = (c->e_byte_array_stop.content_id >>  0) & 0xff;
	*cp++ = (c->e_byte_array_stop.content_id >>  8) & 0xff;
	*cp++ = (c->e_byte_array_stop.content_id >> 16) & 0xff;
	*cp++ = (c->e_byte_array_stop.content_id >> 24) & 0xff;
    } else {
	cp += itf8_put(cp, 1 + itf8_size(c->e_byte_array_stop.content_id));
	*cp++ = c->e_byte_array_stop.stop;
	cp += itf8_put(cp, c->e_byte_array_stop.content_id);
    }

    BLOCK_APPEND(b, buf, cp-buf);
    len += cp-buf;

    return len;
}